

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_lock.c
# Opt level: O0

ALLEGRO_LOCKED_REGION *
al_lock_bitmap_region_blocked
          (ALLEGRO_BITMAP *bitmap,int x_block,int y_block,int width_block,int height_block,int flags
          )

{
  _Bool _Var1;
  int format;
  int iVar2;
  int iVar3;
  ALLEGRO_LOCKED_REGION *pAVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ALLEGRO_BITMAP *in_RDI;
  int in_R8D;
  uint in_R9D;
  int block_height;
  int block_width;
  int bitmap_flags;
  int bitmap_format;
  ALLEGRO_LOCKED_REGION *lr;
  int in_stack_00000060;
  int local_18;
  int local_14;
  ALLEGRO_BITMAP *local_10;
  ALLEGRO_LOCKED_REGION *local_8;
  
  format = al_get_bitmap_format(in_RDI);
  al_get_bitmap_flags(in_RDI);
  iVar2 = al_get_pixel_block_width(format);
  iVar3 = al_get_pixel_block_height(format);
  if (((iVar2 == 1) && (iVar3 == 1)) && (_Var1 = _al_pixel_format_is_video_only(format), !_Var1)) {
    pAVar4 = al_lock_bitmap_region
                       (bitmap,x_block,y_block,width_block,height_block,flags,in_stack_00000060);
    return pAVar4;
  }
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_RDI->parent != (ALLEGRO_BITMAP *)0x0) {
    if ((in_RDI->xofs % iVar2 != 0) || (in_RDI->yofs % iVar3 != 0)) {
      return (ALLEGRO_LOCKED_REGION *)0x0;
    }
    local_14 = in_RDI->xofs / iVar2 + in_ESI;
    local_18 = in_RDI->yofs / iVar3 + in_EDX;
    local_10 = in_RDI->parent;
  }
  if ((local_10->locked & 1U) == 0) {
    if ((in_R9D & 1) == 0) {
      local_10->dirty = true;
    }
    local_10->lock_x = local_14 * iVar2;
    local_10->lock_y = local_18 * iVar3;
    local_10->lock_w = in_ECX * iVar2;
    local_10->lock_h = in_R8D * iVar3;
    local_10->lock_flags = in_R9D;
    local_8 = (*local_10->vt->lock_compressed_region)
                        (local_10,local_10->lock_x,local_10->lock_y,local_10->lock_w,
                         local_10->lock_h,in_R9D);
    if (local_8 == (ALLEGRO_LOCKED_REGION *)0x0) {
      local_8 = (ALLEGRO_LOCKED_REGION *)0x0;
    }
    else {
      local_10->locked = true;
    }
  }
  else {
    local_8 = (ALLEGRO_LOCKED_REGION *)0x0;
  }
  return local_8;
}

Assistant:

ALLEGRO_LOCKED_REGION *al_lock_bitmap_region_blocked(ALLEGRO_BITMAP *bitmap,
   int x_block, int y_block, int width_block, int height_block, int flags)
{
   ALLEGRO_LOCKED_REGION *lr;
   int bitmap_format = al_get_bitmap_format(bitmap);
   int bitmap_flags = al_get_bitmap_flags(bitmap);
   int block_width = al_get_pixel_block_width(bitmap_format);
   int block_height = al_get_pixel_block_height(bitmap_format);
   ASSERT(x_block >= 0);
   ASSERT(y_block >= 0);
   ASSERT(width_block >= 0);
   ASSERT(height_block >= 0);

   if (block_width == 1 && block_height == 1 && !_al_pixel_format_is_video_only(bitmap_format)) {
      return al_lock_bitmap_region(bitmap, x_block, y_block, width_block,
         height_block, bitmap_format, flags);
   }

   /* Currently, this is the only format that gets to this point */
   ASSERT(_al_pixel_format_is_compressed(bitmap_format));
   ASSERT(!(bitmap_flags & ALLEGRO_MEMORY_BITMAP));

   /* For sub-bitmaps */
   if (bitmap->parent) {
      if (bitmap->xofs % block_width != 0 ||
          bitmap->yofs % block_height != 0) {
         return NULL;
      }
      x_block += bitmap->xofs / block_width;
      y_block += bitmap->yofs / block_height;
      bitmap = bitmap->parent;
   }

   if (bitmap->locked)
      return NULL;

   if (!(flags & ALLEGRO_LOCK_READONLY))
      bitmap->dirty = true;

   ASSERT(x_block + width_block
      <= _al_get_least_multiple(bitmap->w, block_width) / block_width);
   ASSERT(y_block + height_block
      <= _al_get_least_multiple(bitmap->h, block_height) / block_height);

   bitmap->lock_x = x_block * block_width;
   bitmap->lock_y = y_block * block_height;
   bitmap->lock_w = width_block * block_width;
   bitmap->lock_h = height_block * block_height;
   bitmap->lock_flags = flags;

   lr = bitmap->vt->lock_compressed_region(bitmap, bitmap->lock_x,
      bitmap->lock_y, bitmap->lock_w, bitmap->lock_h, flags);
   if (!lr) {
      return NULL;
   }

   bitmap->locked = true;

   return lr;
}